

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CompilationUnitSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CompilationUnitSyntax,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::MemberSyntax> *args,Token *args_1)

{
  Token endOfFile;
  CompilationUnitSyntax *this_00;
  
  this_00 = (CompilationUnitSyntax *)allocate(this,0x60,8);
  endOfFile.kind = args_1->kind;
  endOfFile._2_1_ = args_1->field_0x2;
  endOfFile.numFlags.raw = (args_1->numFlags).raw;
  endOfFile.rawLen = args_1->rawLen;
  endOfFile.info = args_1->info;
  slang::syntax::CompilationUnitSyntax::CompilationUnitSyntax(this_00,args,endOfFile);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }